

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand.c
# Opt level: O0

void randinit(uint seed)

{
  __pid_t _Var1;
  unsigned_long uVar2;
  uint in_EDI;
  timeval now;
  timeval local_18;
  uint local_4;
  
  local_4 = in_EDI;
  gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  initstate(local_4,seedState,0x100);
  uVar2 = clock();
  _Var1 = getpid();
  uVar2 = mix(local_18.tv_usec,uVar2,(long)_Var1);
  initstate((uint)uVar2,unseededState,0x100);
  return;
}

Assistant:

void randinit(unsigned int seed)
{
	struct timeval 		now;
	gettimeofday(&now, 0);

	initstate(seed, seedState, 256);
	initstate(mix(now.tv_usec, clock(), getpid()), unseededState, 256);
}